

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expanddims.cpp
# Opt level: O0

int __thiscall
ncnn::ExpandDims::forward(ExpandDims *this,Mat *bottom_blob,Mat *top_blob,Option *opt)

{
  int iVar1;
  bool bVar2;
  bool bVar3;
  int *piVar4;
  long in_RSI;
  long in_RDI;
  bool bVar5;
  bool bVar6;
  int axis;
  int i;
  int *axes_ptr;
  bool _expand_c;
  bool _expand_h;
  bool _expand_w;
  int dims;
  int h;
  int w;
  Mat *in_stack_fffffffffffffdc0;
  Mat *in_stack_fffffffffffffdc8;
  Mat *this_00;
  Allocator *in_stack_fffffffffffffdf8;
  int in_stack_fffffffffffffe00;
  int in_stack_fffffffffffffe04;
  Mat *in_stack_fffffffffffffe08;
  Allocator *in_stack_fffffffffffffe60;
  int in_stack_fffffffffffffe6c;
  int in_stack_fffffffffffffe70;
  int in_stack_fffffffffffffe74;
  Mat *in_stack_fffffffffffffe78;
  int local_48;
  int local_44;
  int local_4;
  
  iVar1 = *(int *)(in_RSI + 0x28);
  bVar3 = false;
  bVar5 = false;
  bVar6 = false;
  bVar2 = ncnn::Mat::empty(in_stack_fffffffffffffdc0);
  if (bVar2) {
    bVar3 = *(int *)(in_RDI + 0xd0) != 0;
    bVar5 = *(int *)(in_RDI + 0xd4) != 0;
    bVar6 = *(int *)(in_RDI + 0xd8) != 0;
  }
  else {
    piVar4 = ncnn::Mat::operator_cast_to_int_((Mat *)(in_RDI + 0xe0));
    for (local_44 = 0; local_44 < *(int *)(in_RDI + 0x10c); local_44 = local_44 + 1) {
      local_48 = piVar4[local_44];
      if (local_48 < 0) {
        local_48 = iVar1 + 1 + local_48;
      }
      if ((iVar1 == 1) && (local_48 == 0)) {
        bVar5 = true;
      }
      if ((iVar1 == 1) && (local_48 == 1)) {
        bVar3 = true;
      }
      if ((iVar1 == 2) && (local_48 == 0)) {
        bVar6 = true;
      }
      if ((iVar1 == 2) && (local_48 == 1)) {
        bVar5 = true;
      }
      if ((iVar1 == 2) && (local_48 == 2)) {
        bVar3 = true;
      }
    }
  }
  ncnn::Mat::operator=(in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0);
  if (iVar1 == 1) {
    if ((bVar3) && (bVar5)) {
      ncnn::Mat::reshape(in_stack_fffffffffffffe78,in_stack_fffffffffffffe74,
                         in_stack_fffffffffffffe70,in_stack_fffffffffffffe6c,
                         in_stack_fffffffffffffe60);
      ncnn::Mat::operator=(in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0);
      ncnn::Mat::~Mat((Mat *)0x6a018d);
    }
    else if (bVar3) {
      ncnn::Mat::reshape(in_stack_fffffffffffffe08,in_stack_fffffffffffffe04,
                         in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
      ncnn::Mat::operator=(in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0);
      ncnn::Mat::~Mat((Mat *)0x6a0215);
    }
    else if (bVar5) {
      ncnn::Mat::reshape(in_stack_fffffffffffffe08,in_stack_fffffffffffffe04,
                         in_stack_fffffffffffffe00,in_stack_fffffffffffffdf8);
      ncnn::Mat::operator=(in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0);
      ncnn::Mat::~Mat((Mat *)0x6a029d);
    }
  }
  if (iVar1 == 2) {
    if (bVar3) {
      ncnn::Mat::reshape(in_stack_fffffffffffffe78,in_stack_fffffffffffffe74,
                         in_stack_fffffffffffffe70,in_stack_fffffffffffffe6c,
                         in_stack_fffffffffffffe60);
      ncnn::Mat::operator=(in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0);
      ncnn::Mat::~Mat((Mat *)0x6a0342);
    }
    else if (bVar5) {
      this_00 = (Mat *)&stack0xfffffffffffffe40;
      ncnn::Mat::reshape(in_stack_fffffffffffffe78,in_stack_fffffffffffffe74,
                         in_stack_fffffffffffffe70,in_stack_fffffffffffffe6c,
                         in_stack_fffffffffffffe60);
      ncnn::Mat::operator=(this_00,in_stack_fffffffffffffdc0);
      ncnn::Mat::~Mat((Mat *)0x6a03d6);
    }
    else if (bVar6) {
      in_stack_fffffffffffffdc0 = (Mat *)&stack0xfffffffffffffdf8;
      ncnn::Mat::reshape(in_stack_fffffffffffffe78,in_stack_fffffffffffffe74,
                         in_stack_fffffffffffffe70,in_stack_fffffffffffffe6c,
                         in_stack_fffffffffffffe60);
      ncnn::Mat::operator=(in_stack_fffffffffffffdc8,in_stack_fffffffffffffdc0);
      ncnn::Mat::~Mat((Mat *)0x6a0460);
    }
  }
  bVar3 = ncnn::Mat::empty(in_stack_fffffffffffffdc0);
  if (bVar3) {
    local_4 = -100;
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

int ExpandDims::forward(const Mat& bottom_blob, Mat& top_blob, const Option& opt) const
{
    int w = bottom_blob.w;
    int h = bottom_blob.h;
    int dims = bottom_blob.dims;

    bool _expand_w = false;
    bool _expand_h = false;
    bool _expand_c = false;

    if (axes.empty())
    {
        _expand_w = expand_w;
        _expand_h = expand_h;
        _expand_c = expand_c;
    }
    else
    {
        const int* axes_ptr = axes;
        for (int i = 0; i < axes.w; i++)
        {
            int axis = axes_ptr[i];
            if (axis < 0)
                axis = dims + 1 + axis;

            if (dims == 1 && axis == 0)
            {
                _expand_h = true;
            }
            if (dims == 1 && axis == 1)
            {
                _expand_w = true;
            }
            if (dims == 2 && axis == 0)
            {
                _expand_c = true;
            }
            if (dims == 2 && axis == 1)
            {
                _expand_h = true;
            }
            if (dims == 2 && axis == 2)
            {
                _expand_w = true;
            }
        }
    }

    top_blob = bottom_blob;

    if (dims == 1)
    {
        if (_expand_w && _expand_h)
        {
            top_blob = bottom_blob.reshape(1, w, 1, opt.blob_allocator);
        }
        else if (_expand_w)
        {
            top_blob = bottom_blob.reshape(1, w, opt.blob_allocator);
        }
        else if (_expand_h)
        {
            top_blob = bottom_blob.reshape(w, 1, opt.blob_allocator);
        }
    }

    if (dims == 2)
    {
        if (_expand_w)
        {
            top_blob = bottom_blob.reshape(1, w, h, opt.blob_allocator);
        }
        else if (_expand_h)
        {
            top_blob = bottom_blob.reshape(w, 1, h, opt.blob_allocator);
        }
        else if (_expand_c)
        {
            top_blob = bottom_blob.reshape(w, h, 1, opt.blob_allocator);
        }
    }

    if (top_blob.empty())
        return -100;

    return 0;
}